

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  int iVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  int *piVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  int *piVar14;
  long lVar15;
  int *piVar16;
  BYTE *pBVar17;
  uint uVar18;
  int *piVar19;
  seqDef *psVar20;
  U32 UVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t offbaseFound;
  uint local_c8;
  size_t local_c0;
  int *local_b8;
  ulong local_b0;
  ulong local_a8;
  uint local_9c;
  ZSTD_matchState_t *local_98;
  uint local_8c;
  int *local_88;
  int *local_80;
  int *local_78;
  BYTE *local_70;
  BYTE *local_68;
  seqStore_t *local_60;
  BYTE *local_58;
  uint *local_50;
  BYTE *local_48;
  int *local_40;
  BYTE *local_38;
  
  local_68 = (ms->window).base;
  local_8c = (ms->window).dictLimit;
  local_b0 = (ulong)local_8c;
  uVar6 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar6 < 6) {
    uVar7 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar7) {
    uVar6 = uVar7;
  }
  local_70 = local_68 + local_b0;
  local_c8 = *rep;
  pZVar2 = ms->dictMatchState;
  local_78 = (int *)(pZVar2->window).nextSrc;
  local_58 = (pZVar2->window).base;
  local_38 = local_58 + (pZVar2->window).dictLimit;
  uVar7 = ((int)src - ((int)local_70 + (int)local_38)) + (int)local_78;
  piVar19 = (int *)((long)src + (ulong)(uVar7 == 0));
  if (uVar7 < local_c8) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar18 = rep[1];
  local_50 = rep;
  if (uVar7 < uVar18) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_b8 = (int *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar19 < local_88) {
    local_8c = ((int)local_58 - (int)local_78) + local_8c;
    local_48 = local_58 + -(ulong)local_8c;
    local_40 = local_b8 + -8;
    local_98 = ms;
    local_60 = seqStore;
    do {
      piVar14 = local_b8;
      uVar7 = (((int)piVar19 - (int)local_68) - local_c8) + 1;
      piVar16 = (int *)(local_68 + uVar7);
      if (uVar7 < (uint)local_b0) {
        piVar16 = (int *)(local_58 + (uVar7 - local_8c));
      }
      local_9c = uVar18;
      if ((uVar7 - (uint)local_b0 < 0xfffffffd) && (*piVar16 == *(int *)((long)piVar19 + 1))) {
        piVar11 = local_b8;
        if (uVar7 < (uint)local_b0) {
          piVar11 = local_78;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar16 + 1),(BYTE *)local_b8,
                           (BYTE *)piVar11,local_70);
        uVar23 = sVar9 + 4;
      }
      else {
        uVar23 = 0;
      }
      pZVar2 = local_98;
      local_c0 = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_6
                           (local_98,(BYTE *)piVar19,(BYTE *)piVar14,&local_c0);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_5
                           (local_98,(BYTE *)piVar19,(BYTE *)piVar14,&local_c0);
      }
      else {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_4
                           (local_98,(BYTE *)piVar19,(BYTE *)piVar14,&local_c0);
      }
      uVar24 = uVar23;
      if (uVar23 < uVar10) {
        uVar24 = uVar10;
      }
      if (uVar24 < 4) {
        pZVar2->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar19 - (long)src));
        piVar19 = (int *)((long)piVar19 + ((ulong)((long)piVar19 - (long)src) >> 8) + 1);
        uVar18 = local_9c;
      }
      else {
        local_80 = piVar19;
        local_a8 = local_c0;
        if (uVar10 <= uVar23) {
          local_80 = (int *)((long)piVar19 + 1);
          local_a8 = 1;
        }
        if (piVar19 < local_88) {
          do {
            pZVar2 = local_98;
            piVar14 = (int *)((long)piVar19 + 1);
            uVar7 = ((int)piVar14 - (int)local_68) - local_c8;
            piVar16 = (int *)(local_68 + uVar7);
            if (uVar7 < (uint)local_b0) {
              piVar16 = (int *)(local_58 + (uVar7 - local_8c));
            }
            if ((uVar7 - (uint)local_b0 < 0xfffffffd) && (*piVar16 == *piVar14)) {
              piVar11 = local_b8;
              if (uVar7 < (uint)local_b0) {
                piVar11 = local_78;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar16 + 1),(BYTE *)local_b8,
                                 (BYTE *)piVar11,local_70);
              if (sVar9 < 0xfffffffffffffffc) {
                uVar7 = 0x1f;
                if ((uint)local_a8 != 0) {
                  for (; (uint)local_a8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                if ((int)((uVar7 ^ 0x1f) + (int)uVar24 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  local_a8 = 1;
                  uVar24 = sVar9 + 4;
                  local_80 = piVar14;
                }
              }
            }
            local_c0 = 999999999;
            if (uVar6 == 6) {
              uVar23 = ZSTD_BtFindBestMatch_dictMatchState_6
                                 (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
            }
            else if (uVar6 == 5) {
              uVar23 = ZSTD_BtFindBestMatch_dictMatchState_5
                                 (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
            }
            else {
              uVar23 = ZSTD_BtFindBestMatch_dictMatchState_4
                                 (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
            }
            pZVar2 = local_98;
            if (uVar23 < 4) {
LAB_001747b8:
              if (local_88 <= piVar14) break;
              piVar14 = (int *)((long)piVar19 + 2);
              uVar7 = ((int)piVar14 - (int)local_68) - local_c8;
              piVar16 = (int *)(local_68 + uVar7);
              if (uVar7 < (uint)local_b0) {
                piVar16 = (int *)(local_58 + (uVar7 - local_8c));
              }
              if ((uVar7 - (uint)local_b0 < 0xfffffffd) && (*piVar16 == *piVar14)) {
                piVar11 = local_b8;
                if (uVar7 < (uint)local_b0) {
                  piVar11 = local_78;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar16 + 1),
                                   (BYTE *)local_b8,(BYTE *)piVar11,local_70);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar7 = 0x1f;
                  if ((uint)local_a8 != 0) {
                    for (; (uint)local_a8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if ((int)((uVar7 ^ 0x1f) + (int)uVar24 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                    local_a8 = 1;
                    uVar24 = sVar9 + 4;
                    local_80 = piVar14;
                  }
                }
              }
              local_c0 = 999999999;
              if (uVar6 == 6) {
                uVar23 = ZSTD_BtFindBestMatch_dictMatchState_6
                                   (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
              }
              else if (uVar6 == 5) {
                uVar23 = ZSTD_BtFindBestMatch_dictMatchState_5
                                   (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
              }
              else {
                uVar23 = ZSTD_BtFindBestMatch_dictMatchState_4
                                   (pZVar2,(BYTE *)piVar14,(BYTE *)local_b8,&local_c0);
              }
              if (uVar23 < 4) break;
              uVar7 = 0x1f;
              if ((uint)local_a8 != 0) {
                for (; (uint)local_a8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              iVar3 = 0x1f;
              if ((uint)local_c0 != 0) {
                for (; (uint)local_c0 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)uVar23 * 4 - iVar3 <= (int)((uVar7 ^ 0x1f) + (int)uVar24 * 4 + -0x18)) break;
            }
            else {
              uVar7 = 0x1f;
              if ((uint)local_a8 != 0) {
                for (; (uint)local_a8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              iVar3 = 0x1f;
              if ((uint)local_c0 != 0) {
                for (; (uint)local_c0 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)uVar23 * 4 - iVar3 <= (int)((uVar7 ^ 0x1f) + (int)uVar24 * 4 + -0x1b))
              goto LAB_001747b8;
            }
            uVar24 = uVar23;
            local_a8 = local_c0;
            piVar19 = piVar14;
            local_80 = piVar14;
          } while (piVar14 < local_88);
        }
        UVar21 = (U32)local_a8;
        piVar19 = local_80;
        if (3 < local_a8) {
          pBVar12 = (BYTE *)((long)local_80 + (-(long)local_68 - local_a8) + -0xfffffffd);
          pBVar13 = local_68;
          pBVar17 = local_70;
          if ((uint)pBVar12 < (uint)local_b0) {
            pBVar13 = local_48;
            pBVar17 = local_38;
          }
          if ((src < local_80) && (uVar23 = (ulong)pBVar12 & 0xffffffff, pBVar17 < pBVar13 + uVar23)
             ) {
            pBVar13 = pBVar13 + uVar23;
            do {
              piVar14 = (int *)((long)piVar19 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar14 != *pBVar13) ||
                 (uVar24 = uVar24 + 1, piVar19 = piVar14, piVar14 <= src)) break;
            } while (pBVar17 < pBVar13);
          }
          local_9c = local_c8;
          local_c8 = UVar21 - 3;
        }
        if (local_60->maxNbSeq <=
            (ulong)((long)local_60->sequences - (long)local_60->sequencesStart >> 3)) {
LAB_00174d0c:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_60->maxNbLit) {
LAB_00174ced:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar23 = (long)piVar19 - (long)src;
        pBVar17 = local_60->lit;
        if (local_60->litStart + local_60->maxNbLit < pBVar17 + uVar23) {
LAB_00174d2b:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b8 < piVar19) {
LAB_00174d4a:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < piVar19) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)piVar19,(BYTE *)local_40);
LAB_00174a0c:
          local_60->lit = local_60->lit + uVar23;
          if (0xffff < uVar23) {
            if (local_60->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_60->longLengthType = ZSTD_llt_literalLength;
            local_60->longLengthPos =
                 (U32)((ulong)((long)local_60->sequences - (long)local_60->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar17 = *src;
          *(undefined8 *)(pBVar17 + 8) = uVar4;
          pBVar17 = local_60->lit;
          if (0x10 < uVar23) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar17 + 0x18) = uVar4;
            if (0x20 < (long)uVar23) {
              lVar15 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
                uVar4 = puVar1[1];
                pBVar13 = pBVar17 + lVar15 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar4;
                lVar15 = lVar15 + 0x20;
              } while (pBVar13 + 0x20 < pBVar17 + uVar23);
            }
            goto LAB_00174a0c;
          }
          local_60->lit = pBVar17 + uVar23;
        }
        psVar5 = local_60;
        psVar20 = local_60->sequences;
        psVar20->litLength = (U16)uVar23;
        psVar20->offBase = UVar21;
        if (uVar24 < 3) {
LAB_00174cce:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar24 - 3) {
          if (local_60->longLengthType != ZSTD_llt_none) {
LAB_00174d69:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_60->longLengthType = ZSTD_llt_matchLength;
          local_60->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)local_60->sequencesStart) >> 3);
        }
        psVar20->mlBase = (U16)(uVar24 - 3);
        psVar20 = psVar20 + 1;
        local_60->sequences = psVar20;
        if (local_98->lazySkipping != 0) {
          local_98->lazySkipping = 0;
        }
        src = (void *)((long)piVar19 + uVar24);
        piVar19 = (int *)src;
        uVar18 = local_9c;
        uVar7 = local_9c;
        if (src <= local_88) {
          do {
            uVar22 = uVar7;
            uVar7 = local_c8;
            piVar14 = local_b8;
            uVar8 = ((int)src - (int)local_68) - uVar22;
            pBVar17 = local_68;
            if (uVar8 < (uint)local_b0) {
              pBVar17 = local_48;
            }
            piVar19 = (int *)src;
            uVar18 = uVar22;
            local_c8 = uVar7;
            if ((0xfffffffc < uVar8 - (uint)local_b0) || (*(int *)(pBVar17 + uVar8) != *src)) break;
            piVar19 = local_b8;
            if (uVar8 < (uint)local_b0) {
              piVar19 = local_78;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar17 + uVar8) + 4),
                               (BYTE *)local_b8,(BYTE *)piVar19,local_70);
            if (psVar5->maxNbSeq <= (ulong)((long)psVar20 - (long)psVar5->sequencesStart >> 3))
            goto LAB_00174d0c;
            if (0x20000 < psVar5->maxNbLit) goto LAB_00174ced;
            pBVar17 = psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < pBVar17) goto LAB_00174d2b;
            if (piVar14 < src) goto LAB_00174d4a;
            if (local_40 < src) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)src,(BYTE *)src,(BYTE *)local_40);
            }
            else {
              uVar4 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar17 = *src;
              *(undefined8 *)(pBVar17 + 8) = uVar4;
            }
            psVar20 = psVar5->sequences;
            psVar20->litLength = 0;
            psVar20->offBase = 1;
            if (sVar9 + 4 < 3) goto LAB_00174cce;
            if (0xffff < sVar9 + 1) {
              if (psVar5->longLengthType != ZSTD_llt_none) goto LAB_00174d69;
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar20 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar20->mlBase = (U16)(sVar9 + 1);
            psVar20 = psVar20 + 1;
            psVar5->sequences = psVar20;
            src = (void *)((long)src + sVar9 + 4);
            piVar19 = (int *)src;
            uVar18 = uVar7;
            local_c8 = uVar22;
          } while (src <= local_88);
        }
      }
    } while (piVar19 < local_88);
  }
  *local_50 = local_c8;
  local_50[1] = uVar18;
  return (long)local_b8 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}